

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> * __thiscall
rudp::session::update_ack
          (vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
           *__return_storage_ptr__,session *this,uint8_t new_acknowledge_head)

{
  bool bVar1;
  iterator pvVar2;
  pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
  *ppVar3;
  pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
  *ppVar4;
  iterator pvVar5;
  difference_type dVar6;
  byte end;
  long local_38;
  size_t acknowledged_count;
  uint8_t new_acknowledge_head_local;
  session *this_local;
  vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> *cbs;
  
  std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::vector
            (__return_storage_ptr__);
  if ((new_acknowledge_head != (uint8_t)(this->acknowledge_head + 0xff)) &&
     (bVar1 = is_valid_sequence_number(this,new_acknowledge_head), bVar1)) {
    end = new_acknowledge_head + 1;
    local_38 = 0;
    if (this->acknowledge_head < end) {
      pvVar2 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::begin(&this->send_buffer);
      ppVar3 = std::
               next<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*>
                         (pvVar2,(ulong)this->acknowledge_head);
      pvVar2 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::begin(&this->send_buffer);
      ppVar4 = std::
               next<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*>
                         (pvVar2,(ulong)end);
      local_38 = std::
                 count_if<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*,rudp::session::update_ack(unsigned_char)::__0>
                           (ppVar3,ppVar4);
      pvVar2 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::begin(&this->send_buffer);
      ppVar3 = std::
               next<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*>
                         (pvVar2,(ulong)this->acknowledge_head);
      pvVar2 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::begin(&this->send_buffer);
      ppVar4 = std::
               next<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*>
                         (pvVar2,(ulong)end);
      std::
      for_each<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*,rudp::session::update_ack(unsigned_char)::__1>
                (ppVar3,ppVar4,(anon_class_8_1_ba1d3b54)__return_storage_ptr__);
    }
    else if (end < this->acknowledge_head) {
      pvVar2 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::begin(&this->send_buffer);
      ppVar3 = std::
               next<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*>
                         (pvVar2,(ulong)this->acknowledge_head);
      pvVar2 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::end(&this->send_buffer);
      local_38 = std::
                 count_if<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*,rudp::session::update_ack(unsigned_char)::__2>
                           (ppVar3,pvVar2);
      pvVar2 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::begin(&this->send_buffer);
      pvVar5 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::begin(&this->send_buffer);
      ppVar3 = std::
               next<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*>
                         (pvVar5,(ulong)end);
      dVar6 = std::
              count_if<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*,rudp::session::update_ack(unsigned_char)::__3>
                        (pvVar2,ppVar3);
      local_38 = local_38 + dVar6;
      pvVar2 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::begin(&this->send_buffer);
      ppVar3 = std::
               next<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*>
                         (pvVar2,(ulong)this->acknowledge_head);
      pvVar2 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::end(&this->send_buffer);
      std::
      for_each<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*,rudp::session::update_ack(unsigned_char)::__4>
                (ppVar3,pvVar2,(anon_class_8_1_ba1d3b54)__return_storage_ptr__);
      pvVar2 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::begin(&this->send_buffer);
      pvVar5 = std::
               array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
               ::begin(&this->send_buffer);
      ppVar3 = std::
               next<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*>
                         (pvVar5,(ulong)end);
      std::
      for_each<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>*,rudp::session::update_ack(unsigned_char)::__5>
                (pvVar2,ppVar3,(anon_class_8_1_ba1d3b54)__return_storage_ptr__);
    }
    this->unacknowledged_packet_count = this->unacknowledged_packet_count - local_38;
    clear_retransmission_timer(this,this->acknowledge_head,end);
    this->acknowledge_head = end;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< send_cb_t > session::update_ack( uint8_t new_acknowledge_head ) {
    std::vector< send_cb_t > cbs;
    if( new_acknowledge_head == uint8_t( acknowledge_head - 1u ) ) return cbs;
    if( !is_valid_sequence_number( new_acknowledge_head ) ) return cbs;
    ++new_acknowledge_head;
    size_t acknowledged_count = 0u;
    if( acknowledge_head < new_acknowledge_head ) {
      acknowledged_count = std::count_if( std::next( send_buffer.begin(), acknowledge_head ), std::next( send_buffer.begin(), new_acknowledge_head ), []( const auto &v ) -> bool { return static_cast< bool >( v.first ); } );
      std::for_each( std::next( send_buffer.begin(), acknowledge_head ), std::next( send_buffer.begin(), new_acknowledge_head ), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
    }
    else if( acknowledge_head > new_acknowledge_head ) {
      acknowledged_count = std::count_if( std::next( send_buffer.begin(), acknowledge_head ), send_buffer.end(), []( const auto &v ) -> bool { return static_cast< bool >( v.first ); } );
      acknowledged_count += std::count_if( send_buffer.begin(), std::next( send_buffer.begin(), new_acknowledge_head ), []( const auto &v ) -> bool { return static_cast< bool >( v.first ); } );
      std::for_each( std::next( send_buffer.begin(), acknowledge_head ), send_buffer.end(), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
      std::for_each( send_buffer.begin(), std::next( send_buffer.begin(), new_acknowledge_head ), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
    }
    unacknowledged_packet_count -= acknowledged_count;
    clear_retransmission_timer( acknowledge_head, new_acknowledge_head );
    acknowledge_head = new_acknowledge_head;
    return cbs;
  }